

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

Matrix4x4 * __thiscall
CMU462::Matrix4x4::operator*(Matrix4x4 *__return_storage_ptr__,Matrix4x4 *this,Matrix4x4 *B)

{
  int i;
  long lVar1;
  Matrix4x4 *A;
  Matrix4x4 *C;
  Vector4D *pVVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  __return_storage_ptr__->entries[3].z = 0.0;
  __return_storage_ptr__->entries[3].w = 0.0;
  __return_storage_ptr__->entries[3].x = 0.0;
  __return_storage_ptr__->entries[3].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  __return_storage_ptr__->entries[2].w = 0.0;
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[1].w = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[0].w = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  lVar1 = 0;
  do {
    lVar3 = 0;
    pVVar2 = B->entries;
    do {
      (&__return_storage_ptr__->entries[lVar3].x)[lVar1] = 0.0;
      dVar5 = 0.0;
      lVar4 = 0;
      do {
        dVar5 = dVar5 + *(double *)((long)this + lVar4 * 4) *
                        *(double *)((long)&((Vector4D *)&pVVar2->x)->x + lVar4);
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x20);
      (&__return_storage_ptr__->entries[lVar3].x)[lVar1] = dVar5;
      lVar3 = lVar3 + 1;
      pVVar2 = pVVar2 + 1;
    } while (lVar3 != 4);
    lVar1 = lVar1 + 1;
    this = (Matrix4x4 *)((long)this + 8);
  } while (lVar1 != 4);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::operator*( const Matrix4x4& B ) const {
    const Matrix4x4& A( *this );
    Matrix4x4 C;

    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
       C(i,j) = 0.;

       for( int k = 0; k < 4; k++ )
       {
          C(i,j) += A(i,k)*B(k,j);
       }
    }

    return C;
  }